

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_record.c
# Opt level: O1

void rec_loop_jit(jit_State *J,TraceNo lnk,LoopEvent ev)

{
  if ((J->parent == 0) && (J->exitno == 0)) {
    lj_trace_err(J,LJ_TRERR_LINNER);
  }
  if (ev == LOOPEV_LEAVE) {
    return;
  }
  J->instunroll = 0;
  if ((J->pc == J->startpc) && (J->framedepth + J->retdepth == 0)) {
    lj_record_stop(J,LJ_TRLINK_LOOP,(uint)(J->cur).traceno);
    return;
  }
  lj_record_stop(J,LJ_TRLINK_ROOT,lnk);
  return;
}

Assistant:

static void rec_loop_jit(jit_State *J, TraceNo lnk, LoopEvent ev)
{
  if (J->parent == 0 && J->exitno == 0) {  /* Root trace hit an inner loop. */
    /* Better let the inner loop spawn a side trace back here. */
    lj_trace_err(J, LJ_TRERR_LINNER);
  } else if (ev != LOOPEV_LEAVE) {  /* Side trace enters a compiled loop. */
    J->instunroll = 0;  /* Cannot continue across a compiled loop op. */
    if (J->pc == J->startpc && J->framedepth + J->retdepth == 0)
      lj_record_stop(J, LJ_TRLINK_LOOP, J->cur.traceno);  /* Form extra loop. */
    else
      lj_record_stop(J, LJ_TRLINK_ROOT, lnk);  /* Link to the loop. */
  }  /* Side trace continues across a loop that's left or not entered. */
}